

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int memdbFetch(sqlite3_file *pFile,sqlite3_int64 iOfst,int iAmt,void **pp)

{
  sqlite3_io_methods *p_00;
  MemStore *p;
  void **pp_local;
  int iAmt_local;
  sqlite3_int64 iOfst_local;
  sqlite3_file *pFile_local;
  
  p_00 = pFile[1].pMethods;
  memdbEnter((MemStore *)p_00);
  if ((*(long *)p_00 < iOfst + iAmt) || (((ulong)p_00->xSync & 0x200000000) != 0)) {
    *pp = (void *)0x0;
  }
  else {
    *(int *)&p_00->xSync = *(int *)&p_00->xSync + 1;
    *pp = p_00->xWrite + iOfst;
  }
  memdbLeave((MemStore *)p_00);
  return 0;
}

Assistant:

static int memdbFetch(
  sqlite3_file *pFile,
  sqlite3_int64 iOfst,
  int iAmt,
  void **pp
){
  MemStore *p = ((MemFile*)pFile)->pStore;
  memdbEnter(p);
  if( iOfst+iAmt>p->sz || (p->mFlags & SQLITE_DESERIALIZE_RESIZEABLE)!=0 ){
    *pp = 0;
  }else{
    p->nMmap++;
    *pp = (void*)(p->aData + iOfst);
  }
  memdbLeave(p);
  return SQLITE_OK;
}